

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O2

void __thiscall
QNetworkProxyQuery::QNetworkProxyQuery
          (QNetworkProxyQuery *this,quint16 bindPort,QString *protocolTag,QueryType queryType)

{
  QNetworkProxyQueryPrivate *pQVar1;
  undefined6 in_register_00000032;
  
  (this->d).d.ptr = (QNetworkProxyQueryPrivate *)0x0;
  pQVar1 = QSharedDataPointer<QNetworkProxyQueryPrivate>::operator->(&this->d);
  QUrl::setScheme((QString *)&pQVar1->remote);
  pQVar1 = QSharedDataPointer<QNetworkProxyQueryPrivate>::operator->(&this->d);
  pQVar1->localPort = (int)CONCAT62(in_register_00000032,bindPort);
  pQVar1 = QSharedDataPointer<QNetworkProxyQueryPrivate>::operator->(&this->d);
  pQVar1->type = queryType;
  return;
}

Assistant:

QNetworkProxyQuery::QNetworkProxyQuery(quint16 bindPort, const QString &protocolTag,
                                       QueryType queryType)
{
    d->remote.setScheme(protocolTag);
    d->localPort = bindPort;
    d->type = queryType;
}